

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O3

PropertyT<unsigned_int> * __thiscall
OpenMesh::PropertyContainer::property<unsigned_int>
          (PropertyContainer *this,BasePropHandleT<unsigned_int> _h)

{
  pointer ppBVar1;
  BaseProperty *pBVar2;
  PropertyT<unsigned_int> *pPVar3;
  
  if (((int)_h.super_BaseHandle.idx_ < 0) ||
     (ppBVar1 = (this->properties_).
                super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->properties_).
                         super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1) >> 3) <=
     (int)_h.super_BaseHandle.idx_)) {
    __assert_fail("_h.idx() >= 0 && _h.idx() < (int)properties_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/PropertyContainer.hh"
                  ,0x91,
                  "PropertyT<T> &OpenMesh::PropertyContainer::property(BasePropHandleT<T>) [T = unsigned int]"
                 );
  }
  pBVar2 = ppBVar1[(uint)_h.super_BaseHandle.idx_];
  if (pBVar2 == (BaseProperty *)0x0) {
    __assert_fail("properties_[_h.idx()] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/PropertyContainer.hh"
                  ,0x92,
                  "PropertyT<T> &OpenMesh::PropertyContainer::property(BasePropHandleT<T>) [T = unsigned int]"
                 );
  }
  pPVar3 = (PropertyT<unsigned_int> *)
           __dynamic_cast(pBVar2,&BaseProperty::typeinfo,&PropertyT<unsigned_int>::typeinfo,0);
  if (pPVar3 != (PropertyT<unsigned_int> *)0x0) {
    return pPVar3;
  }
  __assert_fail("p != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/PropertyContainer.hh"
                ,0x97,
                "PropertyT<T> &OpenMesh::PropertyContainer::property(BasePropHandleT<T>) [T = unsigned int]"
               );
}

Assistant:

PropertyT<T>& property(BasePropHandleT<T> _h)
  {
    assert(_h.idx() >= 0 && _h.idx() < (int)properties_.size());
    assert(properties_[_h.idx()] != NULL);
#ifdef OM_FORCE_STATIC_CAST
    return *static_cast  <PropertyT<T>*> (properties_[_h.idx()]);
#else
    PropertyT<T>* p = dynamic_cast<PropertyT<T>*>(properties_[_h.idx()]);
    assert(p != NULL);
    return *p;
#endif
  }